

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
find_idom(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *__return_storage_ptr__,
         map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         *nodes)

{
  int iVar1;
  int *piVar2;
  _Rb_tree_color *p_Var3;
  pair<const_int,_int> pVar4;
  pointer piVar5;
  pointer piVar6;
  undefined8 uVar7;
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  *this;
  _Rb_tree_header *p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  mapped_type *pmVar14;
  ostream *poVar15;
  long *plVar16;
  _Rb_tree_node_base *p_Var17;
  _Base_ptr p_Var18;
  _Self __tmp;
  _Rb_tree_header *p_Var19;
  key_type *__k;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  ulong uVar23;
  vector<int,_std::allocator<int>_> visit;
  vector<int,_std::allocator<int>_> N;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2b8;
  vector<int,_std::allocator<int>_> local_298;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_258;
  _Rb_tree_node_base *local_238;
  _Base_ptr local_230;
  undefined1 local_228 [16];
  _Rb_tree_color *local_218;
  _Rb_tree_color *p_Stack_210;
  _Rb_tree_color *local_208;
  _Map_pointer ppiStack_200;
  _Rb_tree_color *local_1f8;
  _Elt_pointer piStack_1f0;
  _Elt_pointer local_1e8;
  _Map_pointer ppiStack_1e0;
  vector<int,_std::allocator<int>_> local_1d8;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_1c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1b8;
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  *local_188;
  vector<int,_std::allocator<int>_> local_180;
  vector<int,_std::allocator<int>_> local_168;
  vector<int,_std::allocator<int>_> local_150;
  vector<int,_std::allocator<int>_> local_138;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  local_1c0 = nodes;
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::_Rb_tree(&local_60,&nodes->_M_t);
  p_Var8 = &local_60._M_impl.super__Rb_tree_header;
  p_Var12 = &p_Var8->_M_header;
  for (; (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_parent !=
         (_Rb_tree_header *)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(int)*(size_t *)(local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 1) < -2])
  {
    if (-3 < (int)*(size_t *)(local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 1)) {
      p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
  }
  if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
     ((int)((_Rb_tree_header *)p_Var12)->_M_node_count < -1)) {
    p_Var8 = (_Rb_tree_header *)p_Var12;
  }
  local_230 = *(_Base_ptr *)(p_Var8 + 1);
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~_Rb_tree(&local_60);
  p_Var8 = &local_1b8._M_impl.super__Rb_tree_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
  if (order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      != order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    lVar21 = 0;
    uVar23 = 0;
    do {
      if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_258,
                   (iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (int *)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar21));
      }
      else {
        *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *(int *)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar21);
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 4;
    } while (uVar23 < (ulong)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  local_228._0_4_ = -2;
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_228);
  }
  else {
    *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = -2;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_228._0_4_ = -1;
  local_188 = (_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
               *)__return_storage_ptr__;
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_228);
  }
  else {
    *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = -1;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  p_Var9 = (local_1c0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_238 = &(local_1c0->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_238) {
    do {
      if (p_Var9[1]._M_color == ~_S_red) {
        local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_2d8,(iterator)0x0,(int *)(p_Var9 + 1));
        local_228._0_4_ = p_Var9[1]._M_color;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_228 + 8),&local_2d8);
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                    *)&local_1b8,
                   (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_228);
        pVar4 = (pair<const_int,_int>)
                local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
        p_Var3 = (_Rb_tree_color *)
                 local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if ((pair<const_int,_int>)local_228._8_8_ != (pair<const_int,_int>)0x0) {
          operator_delete((void *)local_228._8_8_,(long)p_Stack_210 - local_228._8_8_);
          pVar4 = (pair<const_int,_int>)
                  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
          p_Var3 = (_Rb_tree_color *)
                   local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        local_228._0_4_ = p_Var9[1]._M_color;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_228 + 8),&local_258);
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                    *)&local_1b8,
                   (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_228);
        pVar4 = (pair<const_int,_int>)local_228._8_8_;
        p_Var3 = p_Stack_210;
      }
      if (pVar4 != (pair<const_int,_int>)0x0) {
        operator_delete((void *)pVar4,(long)p_Var3 - (long)pVar4);
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_238);
  }
  do {
    p_Var9 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) break;
    uVar23 = 0;
    bVar22 = false;
    p_Var9 = local_238;
    do {
      piVar2 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23;
      p_Var17 = (local_1c0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = p_Var9;
      if (p_Var17 != (_Rb_tree_node_base *)0x0) {
        do {
          if (*piVar2 <= (int)p_Var17[1]._M_color) {
            p_Var10 = p_Var17;
          }
          p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < *piVar2];
        } while (p_Var17 != (_Base_ptr)0x0);
      }
      p_Var17 = p_Var9;
      if ((p_Var10 != p_Var9) && (p_Var17 = p_Var10, *piVar2 < (int)p_Var10[1]._M_color)) {
        p_Var17 = p_Var9;
      }
      local_228._0_4_ = 0;
      local_228._4_4_ = 0;
      local_228._8_4_ = 0;
      local_228._12_4_ = 0;
      local_218 = (_Rb_tree_color *)0x0;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)local_228,(iterator)0x0,piVar2);
      p_Var12 = p_Var17[1]._M_parent[1]._M_right;
      if (*(_Base_ptr *)(p_Var17[1]._M_parent + 2) != p_Var12) {
        piVar2 = *(int **)p_Var12;
        p_Var12 = &p_Var8->_M_header;
        if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          iVar1 = *piVar2;
          p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (iVar1 <= (int)*(size_t *)(p_Var13 + 1)) {
              p_Var12 = p_Var13;
            }
            p_Var13 = (&p_Var13->_M_left)[(int)*(size_t *)(p_Var13 + 1) < iVar1];
          } while (p_Var13 != (_Base_ptr)0x0);
        }
        p_Var19 = p_Var8;
        if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
           (p_Var19 = (_Rb_tree_header *)p_Var12,
           *piVar2 < (int)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
          p_Var19 = p_Var8;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_2d8,(vector<int,_std::allocator<int>_> *)(p_Var19 + 1));
        p_Var12 = p_Var17[1]._M_parent[1]._M_right;
        if (8 < (ulong)(*(long *)(p_Var17[1]._M_parent + 2) - (long)p_Var12)) {
          uVar20 = 1;
          do {
            p_Var13 = &p_Var8->_M_header;
            if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              iVar1 = **(int **)(&p_Var12->_M_color + uVar20 * 2);
              p_Var18 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if (iVar1 <= (int)p_Var18[1]._M_color) {
                  p_Var13 = p_Var18;
                }
                p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < iVar1];
              } while (p_Var18 != (_Base_ptr)0x0);
            }
            p_Var18 = &p_Var8->_M_header;
            if (((_Rb_tree_header *)p_Var13 != p_Var8) &&
               (p_Var18 = p_Var13,
               **(int **)(&p_Var12->_M_color + uVar20 * 2) < (int)p_Var13[1]._M_color)) {
              p_Var18 = &p_Var8->_M_header;
            }
            std::vector<int,_std::allocator<int>_>::vector(&local_f0,&local_2d8);
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_108,(vector<int,_std::allocator<int>_> *)&p_Var18[1]._M_parent);
            vectors_intersection(&local_298,&local_f0,&local_108);
            piVar6 = local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            piVar5 = local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            if ((pair<const_int,_int>)piVar5 != (pair<const_int,_int>)0x0) {
              operator_delete(piVar5,(long)piVar6 - (long)piVar5);
            }
            if ((pair<const_int,_int>)
                local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pair<const_int,_int>)0x0) {
              operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            uVar20 = uVar20 + 1;
            p_Var12 = p_Var17[1]._M_parent[1]._M_right;
          } while (uVar20 < (ulong)(*(long *)(p_Var17[1]._M_parent + 2) - (long)p_Var12 >> 3));
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_120,(vector<int,_std::allocator<int>_> *)local_228);
        std::vector<int,_std::allocator<int>_>::vector(&local_138,&local_2d8);
        vectors_set_union(&local_298,&local_120,&local_138);
        p_Var3 = local_218;
        uVar7 = local_228._0_8_;
        local_228._0_8_ =
             local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
        local_228._8_8_ =
             local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        local_218 = (_Rb_tree_color *)
                    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if ((pair<const_int,_int>)uVar7 != (pair<const_int,_int>)0x0) {
          operator_delete((void *)uVar7,(long)p_Var3 - uVar7);
        }
        p_Var9 = local_238;
        if ((pair<const_int,_int>)
            local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pair<const_int,_int>)0x0) {
          operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pair<const_int,_int>)
            local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pair<const_int,_int>)0x0) {
          operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      __k = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + uVar23;
      p_Var12 = &p_Var8->_M_header;
      if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if (*__k <= (int)p_Var13[1]._M_color) {
            p_Var12 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < *__k];
        } while (p_Var13 != (_Base_ptr)0x0);
      }
      p_Var13 = &p_Var8->_M_header;
      if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
         (p_Var13 = p_Var12, *__k < (int)p_Var12[1]._M_color)) {
        p_Var13 = &p_Var8->_M_header;
      }
      if ((long)p_Var13[1]._M_left - (long)p_Var13[1]._M_parent != local_228._8_8_ - local_228._0_8_
         ) {
        pmVar14 = std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&local_1b8,__k);
        bVar22 = true;
        std::vector<int,_std::allocator<int>_>::operator=
                  (pmVar14,(vector<int,_std::allocator<int>_> *)local_228);
      }
      if ((pair<const_int,_int>)local_228._0_8_ != (pair<const_int,_int>)0x0) {
        operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < (ulong)((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
    p_Var9 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
  } while (bVar22);
  for (; (_Rb_tree_header *)p_Var9 != p_Var8;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    _Var11 = std::
             __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        p_Var9[1]._M_parent,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        p_Var9[1]._M_left,(_Iter_equals_val<const_int>)(p_Var9 + 1));
    if (((_Base_ptr)_Var11._M_current != p_Var9[1]._M_left) &&
       (p_Var12 = (_Base_ptr)
                  ((long)_Var11._M_current + ((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_left)),
       p_Var9[1]._M_left != p_Var12)) {
      p_Var9[1]._M_left = p_Var12;
    }
  }
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1e8 = (_Elt_pointer)0x0;
  ppiStack_1e0 = (_Map_pointer)0x0;
  local_1f8 = (_Rb_tree_color *)0x0;
  piStack_1f0 = (_Elt_pointer)0x0;
  local_208 = (_Rb_tree_color *)0x0;
  ppiStack_200 = (_Map_pointer)0x0;
  local_218 = (_Rb_tree_color *)0x0;
  p_Stack_210 = (_Rb_tree_color *)0x0;
  local_228._0_8_ = (_Map_pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)local_228,0);
  p_Var12 = local_230;
  p_Var13 = &p_Var8->_M_header;
  if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var18 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)local_230->_M_color <= (int)p_Var18[1]._M_color) {
        p_Var13 = p_Var18;
      }
      p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < (int)local_230->_M_color];
    } while (p_Var18 != (_Base_ptr)0x0);
  }
  p_Var18 = &p_Var8->_M_header;
  if (((_Rb_tree_header *)p_Var13 != p_Var8) &&
     (p_Var18 = p_Var13, (int)local_230->_M_color < (int)p_Var13[1]._M_color)) {
    p_Var18 = &p_Var8->_M_header;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_298,(vector<int,_std::allocator<int>_> *)&p_Var18[1]._M_parent);
  if (local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    p_Var12 = &p_Var8->_M_header;
    if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (*local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start <= (int)p_Var13[1]._M_color) {
          p_Var12 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)
                  [(int)p_Var13[1]._M_color <
                   *local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start];
      } while (p_Var13 != (_Base_ptr)0x0);
    }
    p_Var13 = &p_Var8->_M_header;
    if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
       (p_Var13 = p_Var12,
       *local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start < (int)p_Var12[1]._M_color)) {
      p_Var13 = &p_Var8->_M_header;
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&local_2b8,(vector<int,_std::allocator<int>_> *)&p_Var13[1]._M_parent);
    if (4 < (ulong)((long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      uVar23 = 1;
      do {
        p_Var12 = &p_Var8->_M_header;
        if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          iVar1 = *(int *)((long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar23 * 4);
          p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (iVar1 <= (int)p_Var13[1]._M_color) {
              p_Var12 = p_Var13;
            }
            p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < iVar1];
          } while (p_Var13 != (_Base_ptr)0x0);
        }
        p_Var13 = &p_Var8->_M_header;
        if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
           (p_Var13 = p_Var12,
           *(int *)((long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar23 * 4) < (int)p_Var12[1]._M_color)
           ) {
          p_Var13 = &p_Var8->_M_header;
        }
        std::vector<int,_std::allocator<int>_>::vector(&local_78,&local_2b8);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_90,(vector<int,_std::allocator<int>_> *)&p_Var13[1]._M_parent);
        vectors_set_union(&local_278,&local_78,&local_90);
        piVar6 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        piVar5 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
        local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if ((pair<const_int,_int>)piVar5 != (pair<const_int,_int>)0x0) {
          operator_delete(piVar5,(long)piVar6 - (long)piVar5);
        }
        if ((pair<const_int,_int>)
            local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pair<const_int,_int>)0x0) {
          operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < (ulong)((long)local_298.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_298.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2));
    }
    std::vector<int,_std::allocator<int>_>::vector(&local_150,&local_298);
    std::vector<int,_std::allocator<int>_>::vector(&local_168,&local_2b8);
    vectors_difference(&local_278,&local_150,&local_168);
    p_Var12 = local_230;
    piVar6 = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    piVar5 = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pair<const_int,_int>)piVar5 != (pair<const_int,_int>)0x0) {
      operator_delete(piVar5,(long)piVar6 - (long)piVar5);
    }
    if ((pair<const_int,_int>)
        local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pair<const_int,_int>)0x0) {
      operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pair<const_int,_int>)
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pair<const_int,_int>)0x0) {
      operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pmVar14 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)&local_1b8,(key_type *)p_Var12);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar14,&local_298);
  if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_2d8,
               (iterator)
               local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)p_Var12);
  }
  else {
    *local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = p_Var12->_M_color;
    local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (local_1f8 == (_Rb_tree_color *)(local_1e8 + -1)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)local_228,(int *)p_Var12);
  }
  else {
    *local_1f8 = p_Var12->_M_color;
    local_1f8 = local_1f8 + 1;
  }
  if (local_1f8 != local_218) {
    do {
      p_Var9 = (local_1c0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var17 = local_238;
      if (p_Var9 != (_Rb_tree_node_base *)0x0) {
        do {
          if ((int)*local_218 <= (int)p_Var9[1]._M_color) {
            p_Var17 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)*local_218];
        } while (p_Var9 != (_Base_ptr)0x0);
      }
      p_Var9 = local_238;
      if ((p_Var17 != local_238) && (p_Var9 = p_Var17, (int)*local_218 < (int)p_Var17[1]._M_color))
      {
        p_Var9 = local_238;
      }
      local_230 = p_Var9[1]._M_parent;
      if (local_218 == local_208 + -1) {
        operator_delete(p_Stack_210,0x200);
        local_218 = (_Rb_tree_color *)ppiStack_200[1];
        local_208 = local_218 + 0x80;
        p_Stack_210 = local_218;
        ppiStack_200 = ppiStack_200 + 1;
      }
      else {
        local_218 = local_218 + 1;
      }
      p_Var12 = local_230[1]._M_right;
      if (*(_Base_ptr *)(local_230 + 2) != p_Var12) {
        uVar23 = 0;
        do {
          p_Var3 = *(_Rb_tree_color **)(&p_Var12->_M_color + uVar23 * 2);
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,p_Var3);
          if (_Var11._M_current ==
              local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            p_Var12 = &p_Var8->_M_header;
            if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if ((int)*p_Var3 <= (int)p_Var13[1]._M_color) {
                  p_Var12 = p_Var13;
                }
                p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < (int)*p_Var3];
              } while (p_Var13 != (_Base_ptr)0x0);
            }
            p_Var13 = &p_Var8->_M_header;
            if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
               (p_Var13 = p_Var12, (int)*p_Var3 < (int)p_Var12[1]._M_color)) {
              p_Var13 = &p_Var8->_M_header;
            }
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_2b8,(vector<int,_std::allocator<int>_> *)&p_Var13[1]._M_parent);
            if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              p_Var12 = &p_Var8->_M_header;
              if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                do {
                  if (*local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start <= (int)p_Var13[1]._M_color) {
                    p_Var12 = p_Var13;
                  }
                  p_Var13 = (&p_Var13->_M_left)
                            [(int)p_Var13[1]._M_color <
                             *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start];
                } while (p_Var13 != (_Base_ptr)0x0);
              }
              p_Var13 = &p_Var8->_M_header;
              if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
                 (p_Var13 = p_Var12,
                 *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start < (int)p_Var12[1]._M_color)) {
                p_Var13 = &p_Var8->_M_header;
              }
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_278,(vector<int,_std::allocator<int>_> *)&p_Var13[1]._M_parent);
              if (4 < (ulong)((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start)) {
                uVar20 = 1;
                do {
                  p_Var12 = &p_Var8->_M_header;
                  if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    iVar1 = *(int *)((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start + uVar20 * 4);
                    p_Var13 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      if (iVar1 <= (int)p_Var13[1]._M_color) {
                        p_Var12 = p_Var13;
                      }
                      p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < iVar1];
                    } while (p_Var13 != (_Base_ptr)0x0);
                  }
                  p_Var13 = &p_Var8->_M_header;
                  if (((_Rb_tree_header *)p_Var12 != p_Var8) &&
                     (p_Var13 = p_Var12,
                     *(int *)((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + uVar20 * 4) <
                     (int)p_Var12[1]._M_color)) {
                    p_Var13 = &p_Var8->_M_header;
                  }
                  std::vector<int,_std::allocator<int>_>::vector(&local_180,&local_278);
                  std::vector<int,_std::allocator<int>_>::vector
                            (&local_a8,(vector<int,_std::allocator<int>_> *)&p_Var13[1]._M_parent);
                  vectors_set_union(&local_1d8,&local_180,&local_a8);
                  piVar6 = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                  piVar5 = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((pair<const_int,_int>)piVar5 != (pair<const_int,_int>)0x0) {
                    operator_delete(piVar5,(long)piVar6 - (long)piVar5);
                  }
                  if ((pair<const_int,_int>)
                      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pair<const_int,_int>)0x0) {
                    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_180.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_180.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 < (ulong)((long)local_2b8.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_2b8.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 2));
              }
              std::vector<int,_std::allocator<int>_>::vector(&local_c0,&local_2b8);
              std::vector<int,_std::allocator<int>_>::vector(&local_d8,&local_278);
              vectors_difference(&local_1d8,&local_c0,&local_d8);
              piVar6 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              piVar5 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((pair<const_int,_int>)piVar5 != (pair<const_int,_int>)0x0) {
                operator_delete(piVar5,(long)piVar6 - (long)piVar5);
              }
              if ((pair<const_int,_int>)
                  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pair<const_int,_int>)0x0) {
                operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
              }
              if ((pair<const_int,_int>)
                  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pair<const_int,_int>)0x0) {
                operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_278.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_278.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            pmVar14 = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)&local_1b8,(key_type *)p_Var3);
            std::vector<int,_std::allocator<int>_>::operator=(pmVar14,&local_2b8);
            if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_2d8,
                         (iterator)
                         local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)p_Var3);
            }
            else {
              *local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *p_Var3;
              local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_1f8 == (_Rb_tree_color *)(local_1e8 + -1)) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)local_228,(int *)p_Var3);
            }
            else {
              *local_1f8 = *p_Var3;
              local_1f8 = local_1f8 + 1;
            }
            if ((pair<const_int,_int>)
                local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pair<const_int,_int>)0x0) {
              operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
          uVar23 = uVar23 + 1;
          p_Var12 = local_230[1]._M_right;
        } while (uVar23 < (ulong)(*(long *)(local_230 + 2) - (long)p_Var12 >> 3));
      }
    } while (local_1f8 != local_218);
  }
  this = local_188;
  p_Var9 = (_Rb_tree_node_base *)(local_188 + 8);
  *(undefined4 *)(local_188 + 8) = 0;
  *(undefined8 *)(local_188 + 0x10) = 0;
  *(_Rb_tree_node_base **)(local_188 + 0x18) = p_Var9;
  *(_Rb_tree_node_base **)(local_188 + 0x20) = p_Var9;
  *(undefined8 *)(local_188 + 0x28) = 0;
  if ((_Rb_tree_header *)local_1b8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var8) {
    p_Var12 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (p_Var12[1]._M_left != p_Var12[1]._M_parent) {
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44((p_Var12[1]._M_parent)->_M_color,p_Var12[1]._M_color);
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_insert_unique<std::pair<int_const,int>>(this,(pair<const_int,_int> *)&local_2b8);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar15 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"*** desplay idom ***",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  for (p_Var17 = *(_Rb_tree_node_base **)(this + 0x18); p_Var17 != p_Var9;
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
    poVar15 = (ostream *)std::ostream::operator<<(&std::cout,p_Var17[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
    plVar16 = (long *)std::ostream::operator<<(poVar15,*(int *)&p_Var17[1].field_0x4);
    std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
    std::ostream::put((char)plVar16);
    std::ostream::flush();
  }
  if ((pair<const_int,_int>)
      local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pair<const_int,_int>)0x0) {
    operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_228);
  if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_1b8);
  return (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)this;
}

Assistant:

map<int, int> find_idom(map<int, BasicBlock*> nodes) {
  BasicBlock* exit = find_exit(nodes);

  // step1: Calculate the domin nodes of each block
  // rule: Dom(n) = {n} ∩ Dom(Pred(n))
  map<int, vector<int>> dom;

  // step1.1: initialize dom
  map<int, BasicBlock*>::iterator it;
  vector<int> N;
  for (int i = 0; i < order.size(); i++) {
    N.push_back(order[i]);
  }
  N.push_back(-2);
  N.push_back(-1);
  for (it = nodes.begin(); it != nodes.end(); it++) {
    if (it->first == -1) {
      vector<int> pre;
      pre.push_back(it->first);
      dom.insert(map<int, vector<int>>::value_type(it->first, pre));
    } else {
      dom.insert(map<int, vector<int>>::value_type(it->first, N));
    }
  }

  // step1.2: Loop until dom does not change
  bool flag = true;
  map<int, vector<int>>::iterator iter;
  while (flag) {
    flag = false;
    for (int i = 0; i < N.size(); i++) {
      it = nodes.find(N[i]);
      vector<int> temp;
      temp.push_back(N[i]);
      if (it->second->preBlock.size() > 0) {
        iter = dom.find(it->second->preBlock[0]->id);
        vector<int> v1 = iter->second;
        for (int j = 1; j < it->second->preBlock.size(); j++) {
          iter = dom.find(it->second->preBlock[j]->id);
          v1 = vectors_intersection(v1, iter->second);
        }
        temp = vectors_set_union(temp, v1);
      }
      iter = dom.find(N[i]);
      // the set size monotonically decreases, so if the set size is the same
      // the set contents are the same
      if (iter->second.size() != temp.size()) {
        dom[N[i]] = temp;
        flag = true;
      }
    }
  }
  /*cout << endl << "*** desplay dom ***" << endl;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
      cout << iter->first;
      for (int i = 0; i < iter->second.size(); i++) {
          cout << " " << iter->second[i];
      }
      cout << endl;
  }*/

  // step2: Calculate the immediate domin nodes of each block
  // step2.1: delete node itself;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    iter->second.erase(
        remove(iter->second.begin(), iter->second.end(), iter->first),
        iter->second.end());
  }

  // step2.2: BFS
  vector<int> visit;
  queue<int> q;
  iter = dom.find(exit->id);
  vector<int> v1 = iter->second;
  if (v1.size() > 0) {
    iter = dom.find(v1[0]);
    vector<int> v2 = iter->second;
    for (int i = 1; i < v1.size(); i++) {
      iter = dom.find(v1[i]);
      v2 = vectors_set_union(v2, iter->second);
    }
    v1 = vectors_difference(v1, v2);
  }
  dom[exit->id] = v1;
  visit.push_back(exit->id);
  q.push(exit->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->preBlock.size(); i++) {
      BasicBlock* prep = p->preBlock[i];
      vector<int>::iterator itt = find(visit.begin(), visit.end(), prep->id);
      if (itt == visit.end()) {  // never visit
        iter = dom.find(prep->id);
        vector<int> v1 = iter->second;
        if (v1.size() > 0) {
          iter = dom.find(v1[0]);
          vector<int> v2 = iter->second;
          for (int i = 1; i < v1.size(); i++) {
            iter = dom.find(v1[i]);
            v2 = vectors_set_union(v2, iter->second);
          }
          v1 = vectors_difference(v1, v2);
        }
        dom[prep->id] = v1;
        visit.push_back(prep->id);
        q.push(prep->id);
      }
    }
  }
  /*for (iter = dom.begin(); iter != dom.end(); iter++) {
      cout << iter->first;
      for (int i = 0; i < iter->second.size(); i++) {
          cout << " " << iter->second[i];
      }
      cout << endl;
  }*/
  map<int, int> dom1;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    if (iter->second.size() > 0) {
      dom1.insert(map<int, int>::value_type(iter->first, iter->second[0]));
    }
  }
  map<int, int>::iterator i;
  cout << endl << "*** desplay idom ***" << endl;
  for (i = dom1.begin(); i != dom1.end(); i++) {
    cout << i->first << " " << i->second << endl;
  }
  return dom1;
}